

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O2

void __thiscall CircBufTest::test3(CircBufTest *this)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  int i_3;
  int i;
  int iVar5;
  ulong uVar6;
  undefined1 local_388 [4];
  int local_384;
  CircBufTest *local_380;
  uint8_t dumpBuf [128];
  uint8_t buf [128];
  uint8_t trashBuf [128];
  CircularBuffer bigBuf;
  CircularBuffer tinyBuf;
  
  iVar5 = 1;
  JetHead::CircularBuffer::CircularBuffer(&tinyBuf,1);
  JetHead::CircularBuffer::CircularBuffer(&bigBuf,0x40);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    buf[lVar2] = (uint8_t)lVar2;
  }
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
    buf[lVar2 + 0x40] = (uint8_t)lVar2;
  }
  while (iVar5 != 0x80) {
    rand();
    local_384 = iVar5;
    JetHead::CircularBuffer::write_overflow((uchar *)&bigBuf,(int)buf);
    JetHead::CircularBuffer::copy((uchar *)&bigBuf,(int)dumpBuf);
    JetHead::CircularBuffer::read((uchar *)&bigBuf,(int)trashBuf);
    for (iVar5 = 0; iVar5 < 0x80; iVar5 = iVar4 + iVar5) {
      iVar1 = rand();
      iVar4 = 0x80 - iVar5;
      if (iVar1 % 5 + iVar5 < 0x81) {
        iVar4 = iVar1 % 5;
      }
      JetHead::CircularBuffer::write_overflow((uchar *)&bigBuf,(int)local_388 + iVar5 + 0x90);
    }
    JetHead::CircularBuffer::copy((uchar *)&bigBuf,(int)dumpBuf);
    JetHead::CircularBuffer::read((uchar *)&bigBuf,(int)trashBuf);
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      if (buf[lVar2] != dumpBuf[lVar2]) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"dumpBuf: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)dumpBuf[lVar2]);
        std::endl<char,std::char_traits<char>>(poVar3);
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x227,"Random start smallish write_overflow test failed.");
      }
    }
    iVar5 = local_384 + 1;
  }
  iVar5 = 1;
  while (iVar5 != 0x80) {
    rand();
    local_384 = iVar5;
    JetHead::CircularBuffer::write_overflow((uchar *)&bigBuf,(int)buf);
    JetHead::CircularBuffer::copy((uchar *)&bigBuf,(int)dumpBuf);
    JetHead::CircularBuffer::read((uchar *)&bigBuf,(int)trashBuf);
    for (iVar5 = 0; iVar5 < 0x80; iVar5 = iVar4 + iVar5) {
      iVar1 = rand();
      iVar4 = 0x80 - iVar5;
      if (iVar1 % 0x32 + iVar5 < 0x81) {
        iVar4 = iVar1 % 0x32;
      }
      JetHead::CircularBuffer::write_overflow((uchar *)&bigBuf,(int)local_388 + iVar5 + 0x90);
    }
    JetHead::CircularBuffer::copy((uchar *)&bigBuf,(int)dumpBuf);
    JetHead::CircularBuffer::read((uchar *)&bigBuf,(int)trashBuf);
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
      if (buf[lVar2] != dumpBuf[lVar2]) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x24e," Random start bigish write_overflow test failed.");
      }
    }
    iVar5 = local_384 + 1;
  }
  iVar5 = 1;
  local_380 = this;
  while (iVar5 != 0x80) {
    rand();
    JetHead::CircularBuffer::write_overflow((uchar *)&bigBuf,(int)buf);
    JetHead::CircularBuffer::copy((uchar *)&bigBuf,(int)dumpBuf);
    JetHead::CircularBuffer::read((uchar *)&bigBuf,(int)trashBuf);
    JetHead::CircularBuffer::write_overflow((uchar *)&bigBuf,(int)buf);
    for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
      dumpBuf[lVar2] = '\0';
    }
    local_384 = iVar5;
    for (iVar4 = 0; this = local_380, iVar4 < 0x40; iVar4 = iVar5 + iVar4) {
      iVar1 = rand();
      iVar5 = 0x40 - iVar4;
      if (iVar1 % 5 + iVar4 < 0x41) {
        iVar5 = iVar1 % 5;
      }
      JetHead::CircularBuffer::copy((uchar *)&bigBuf,(int)local_388 + iVar4 + 0x10);
      JetHead::CircularBuffer::read((uchar *)&bigBuf,(int)local_388 + iVar4 + 0x110);
    }
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (uVar6 != dumpBuf[uVar6]) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x275,"smallish read failed.");
      }
    }
    iVar5 = local_384 + 1;
  }
  iVar5 = 1;
  while (iVar5 != 0x80) {
    rand();
    JetHead::CircularBuffer::write_overflow((uchar *)&bigBuf,(int)buf);
    JetHead::CircularBuffer::copy((uchar *)&bigBuf,(int)dumpBuf);
    JetHead::CircularBuffer::read((uchar *)&bigBuf,(int)trashBuf);
    JetHead::CircularBuffer::write_overflow((uchar *)&bigBuf,(int)buf);
    for (lVar2 = 0; lVar2 != 0x80; lVar2 = lVar2 + 1) {
      dumpBuf[lVar2] = '\0';
    }
    local_384 = iVar5;
    for (iVar4 = 0; iVar4 < 0x40; iVar4 = iVar5 + iVar4) {
      iVar1 = rand();
      iVar5 = 0x40 - iVar4;
      if (iVar1 % 0x32 + iVar4 < 0x41) {
        iVar5 = iVar1 % 0x32;
      }
      JetHead::CircularBuffer::copy((uchar *)&bigBuf,(int)local_388 + iVar4 + 0x10);
      JetHead::CircularBuffer::read((uchar *)&bigBuf,(int)local_388 + iVar4 + 0x110);
    }
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (uVar6 != dumpBuf[uVar6]) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x29f,"big reads failed.");
      }
    }
    iVar5 = local_384 + 1;
  }
  JetHead::CircularBuffer::~CircularBuffer(&bigBuf);
  JetHead::CircularBuffer::~CircularBuffer(&tinyBuf);
  return;
}

Assistant:

void CircBufTest::test3()
{

	// Like test2 but using bigBug instead of heapBuf,
	// write_overflow instead of write, and copy instead of read

	CircularBuffer tinyBuf = CircularBuffer(1);
	CircularBuffer bigBuf = CircularBuffer(BUFFER_SIZE / 2 );

	uint8_t buf[BUFFER_SIZE];
	uint8_t dumpBuf[BUFFER_SIZE];
	uint8_t trashBuf[BUFFER_SIZE];

	int count = 0;

	iota(buf, buf + (BUFFER_SIZE / 2), (uint8_t) 0);
	iota(buf + (BUFFER_SIZE / 2), buf + BUFFER_SIZE, (uint8_t) 0);


	// 1st Test: use one arg constructor to make a heapBuf, fill it
	// with a bunch of small writes, then make sure it worked.

	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		count = 0;
		while (count < BUFFER_SIZE)
		{

			int size = rand() % 5;

			if ( (count + size) > BUFFER_SIZE)
				size = BUFFER_SIZE - count;

			bigBuf.write_overflow(buf + count, size);
			count += size;
		}


		bigBuf.copy(dumpBuf, BUFFER_SIZE / 2 );
		bigBuf.read(trashBuf, BUFFER_SIZE / 2 );


		for( int i = 0; i < BUFFER_SIZE / 2; i++)
		{
			if ( buf[i] != dumpBuf[i] )
			{
				cerr << "dumpBuf: " << (int)dumpBuf[i] << endl;
				TestFailed("Random start smallish write_overflow test failed.") ;
			}
		}
	}

	// 2st Test: use one arg constructor to make a bigBuf, fill it
	// with a bunch of big writes, then make sure it worked.

	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		count = 0;
		while (count < BUFFER_SIZE)
		{

			int size = rand() % 50;

			if ( (count + size) > BUFFER_SIZE)
				size = BUFFER_SIZE - count;

			bigBuf.write_overflow(buf + count, size);
			count += size;
		}


		bigBuf.copy(dumpBuf, BUFFER_SIZE / 2 );
		bigBuf.read(trashBuf, BUFFER_SIZE / 2 );


		for( int i = 0; i < BUFFER_SIZE / 2; i++)
		{
			if ( buf[i] != dumpBuf[i] )
			{
				TestFailed(" Random start bigish write_overflow test failed.") ;
			}
		}
	}


	// 3nd Test: refill buffer, read small bits at a time.
	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		bigBuf.write_overflow(buf, BUFFER_SIZE );

		// Why use a for loop when you can do it the C++ way?
		fill(dumpBuf, dumpBuf + BUFFER_SIZE, 0);


		count = 0;
		while( count < BUFFER_SIZE / 2)
		{

			int size = rand() % 5;

			if ( (count + size) > BUFFER_SIZE / 2)
				size = ( BUFFER_SIZE / 2) - count;

			bigBuf.copy(dumpBuf + count , size);
			bigBuf.read(trashBuf + count , size);
			count += size;
		}

		for( int i = 0; i < BUFFER_SIZE / 2; i++ )
		{
			if( dumpBuf[i] != i)
				TestFailed("smallish read failed.");

		}
	}



	// 4th Test: refill buffer, big bits at a time.
	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));


		bigBuf.write_overflow(buf, BUFFER_SIZE );

		// Why use a for loop when you can do it the C++ way?
		fill(dumpBuf, dumpBuf + BUFFER_SIZE, 0);


		count = 0;
		while( count < BUFFER_SIZE / 2)
		{

			int size = rand() % 50;

			if ( (count + size) > BUFFER_SIZE / 2)
				size = (BUFFER_SIZE / 2) - count;

			bigBuf.copy(dumpBuf + count , size);
			bigBuf.read(trashBuf + count , size);
			count += size;

		}

		for( int i = 0; i < BUFFER_SIZE / 2; i++ )
		{
			if( dumpBuf[i] != i )
				TestFailed("big reads failed.");

		}

	}

}